

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O1

Node * node_new_quantifier(int lower,int upper,int by_number)

{
  byte *pbVar1;
  Node *pNVar2;
  
  pNVar2 = (Node *)malloc(0x48);
  if (pNVar2 == (Node *)0x0) {
    pNVar2 = (Node *)0x0;
  }
  else {
    (pNVar2->u).quant.next_head_exact = (_Node *)0x0;
    (pNVar2->u).cclass.mbuf = (BBuf *)0x0;
    (pNVar2->u).call.name = (OnigUChar *)0x0;
    (pNVar2->u).quant.head_exact = (_Node *)0x0;
    (pNVar2->u).base.body = (_Node *)0x0;
    (pNVar2->u).str.end = (OnigUChar *)0x0;
    *(undefined8 *)&pNVar2->u = 0;
    (pNVar2->u).base.parent = (_Node *)0x0;
    *(undefined8 *)((long)&pNVar2->u + 0x40) = 0;
  }
  if (pNVar2 == (Node *)0x0) {
    pNVar2 = (Node *)0x0;
  }
  else {
    (pNVar2->u).base.node_type = ND_QUANT;
    (pNVar2->u).quant.lower = lower;
    (pNVar2->u).quant.upper = upper;
    (pNVar2->u).str.flag = 1;
    *(undefined8 *)((long)&(pNVar2->u).call.name + 4) = 0;
    *(undefined8 *)((long)&(pNVar2->u).quant.head_exact + 4) = 0;
    (pNVar2->u).quant.next_head_exact = (_Node *)0x0;
    (pNVar2->u).cclass.mbuf = (BBuf *)0x0;
    if (by_number != 0) {
      pbVar1 = (byte *)((long)&pNVar2->u + 5);
      *pbVar1 = *pbVar1 | 0x40;
    }
  }
  return pNVar2;
}

Assistant:

static Node*
node_new_quantifier(int lower, int upper, int by_number)
{
  Node* node = node_new();
  CHECK_NULL_RETURN(node);

  ND_SET_TYPE(node, ND_QUANT);
  QUANT_(node)->lower            = lower;
  QUANT_(node)->upper            = upper;
  QUANT_(node)->greedy           = 1;
  QUANT_(node)->emptiness        = BODY_IS_NOT_EMPTY;
  QUANT_(node)->head_exact       = NULL_NODE;
  QUANT_(node)->next_head_exact  = NULL_NODE;
  QUANT_(node)->include_referred = 0;
  QUANT_(node)->empty_status_mem = 0;
  if (by_number != 0)
    ND_STATUS_ADD(node, BY_NUMBER);

  return node;
}